

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::sampleNearest2D
          (tcu *this,ConstPixelBufferAccess *access,Sampler *sampler,float u,float v,IVec3 *offset)

{
  WrapMode mode;
  int iVar1;
  int iVar2;
  int c;
  int c_00;
  float fVar3;
  undefined1 auVar5 [12];
  undefined8 uVar6;
  Vec4 VVar4;
  
  iVar1 = (access->m_size).m_data[0];
  iVar2 = (access->m_size).m_data[1];
  fVar3 = floorf(u);
  c = (int)fVar3 + offset->m_data[0];
  fVar3 = floorf(v);
  c_00 = (int)fVar3 + offset->m_data[1];
  if (((sampler->wrapS == CLAMP_TO_BORDER) && (iVar1 <= c || c < 0)) ||
     ((mode = sampler->wrapT, mode == CLAMP_TO_BORDER && (c_00 < 0 || iVar2 <= c_00)))) {
    VVar4 = lookupBorder(this,&access->m_format,sampler);
  }
  else {
    iVar1 = wrap(sampler->wrapS,c,iVar1);
    iVar2 = wrap(mode,c_00,iVar2);
    VVar4 = lookup((ConstPixelBufferAccess *)this,(int)access,iVar1,iVar2);
  }
  VVar4.m_data[0] = VVar4.m_data[0];
  auVar5._4_4_ = VVar4.m_data[1];
  register0x00001240 = VVar4.m_data[2];
  register0x00001244 = VVar4.m_data[3];
  return (Vec4)VVar4.m_data;
}

Assistant:

static Vec4 sampleNearest2D (const ConstPixelBufferAccess& access, const Sampler& sampler, float u, float v, const IVec3& offset)
{
	int width	= access.getWidth();
	int height	= access.getHeight();

	int x = deFloorFloatToInt32(u)+offset.x();
	int y = deFloorFloatToInt32(v)+offset.y();

	// Check for CLAMP_TO_BORDER.
	if ((sampler.wrapS == Sampler::CLAMP_TO_BORDER && !deInBounds32(x, 0, width)) ||
		(sampler.wrapT == Sampler::CLAMP_TO_BORDER && !deInBounds32(y, 0, height)))
		return lookupBorder(access.getFormat(), sampler);

	int i = wrap(sampler.wrapS, x, width);
	int j = wrap(sampler.wrapT, y, height);

	return lookup(access, i, j, offset.z());
}